

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_temp_var.hpp
# Opt level: O2

void __thiscall
optimization::remove_temp_var::Remove_Temp_Var::optimize_func
          (Remove_Temp_Var *this,MirFunction *func)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::make_shared<optimization::remove_temp_var::Env,mir::inst::MirFunction&>
              ((MirFunction *)&stack0xffffffffffffffc0);
    std::__shared_ptr<optimization::remove_temp_var::Env,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<optimization::remove_temp_var::Env,_(__gnu_cxx::_Lock_policy)2> *)&env,
               (__shared_ptr<optimization::remove_temp_var::Env,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    optimize_blk(this,(BasicBlk *)&p_Var1[1]._M_parent);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    for (auto& blkpair : func.basic_blks) {
      env = std::make_shared<Env>(func);
      optimize_blk(blkpair.second);
    }
  }